

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O2

void __thiscall cmLocalCommonGenerator::~cmLocalCommonGenerator(cmLocalCommonGenerator *this)

{
  ~cmLocalCommonGenerator(this);
  operator_delete(this,0x2f0);
  return;
}

Assistant:

cmLocalCommonGenerator::~cmLocalCommonGenerator() = default;